

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int lws_tls_alloc_pem_to_der_file
              (lws_context *context,char *filename,char *inbuf,lws_filepos_t inlen,uint8_t **buf,
              lws_filepos_t *amount)

{
  uint8_t uVar1;
  uint8_t **ppuVar2;
  lws_filepos_t lVar3;
  int iVar4;
  uint8_t *puVar5;
  char *format;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  bool bVar9;
  uint8_t *pem;
  lws_filepos_t len;
  uint8_t *local_48;
  uint8_t **local_40;
  lws_filepos_t local_38;
  
  local_48 = (uint8_t *)0x0;
  puVar5 = (uint8_t *)inbuf;
  lVar3 = inlen;
  if ((filename == (char *)0x0) ||
     (iVar4 = alloc_file(context,filename,&local_48,&local_38), puVar5 = local_48, lVar3 = local_38,
     iVar4 == 0)) {
    local_38 = lVar3;
    local_48 = puVar5;
    lVar3 = local_38;
    puVar5 = local_48;
    local_40 = buf;
    iVar4 = strncmp((char *)local_48,"-----",5);
    if (iVar4 == 0) {
      if ((filename == (char *)0x0) &&
         (local_48 = (uint8_t *)lws_realloc((void *)0x0,inlen * 3 >> 2,"alloc_der"),
         local_48 == (uint8_t *)0x0)) {
        iVar4 = 1;
        _lws_log(1,"a\n");
      }
      else {
        ppuVar2 = local_40;
        puVar6 = puVar5 + lVar3;
        puVar8 = puVar5 + 5;
        if (5 < (long)lVar3) {
          do {
            if ((*puVar8 == '\n') || (*puVar8 == '-')) break;
            puVar8 = puVar8 + 1;
          } while (puVar8 < puVar6);
        }
        if (*puVar8 == '-') {
          format = "c\n";
          bVar9 = puVar8 < puVar6;
          if (bVar9) {
            uVar1 = *puVar8;
            while (uVar1 != '\n') {
              puVar8 = puVar8 + 1;
              bVar9 = puVar8 < puVar6;
              if (!bVar9) goto LAB_0012a098;
              uVar1 = *puVar8;
            }
            if (bVar9) {
              puVar6 = puVar6 + -2;
              puVar7 = puVar6;
              for (; (puVar5 < puVar6 && (puVar7 = puVar6, *puVar6 != '\n')); puVar6 = puVar6 + -1)
              {
                puVar7 = puVar5;
              }
              if (*puVar7 == '\n') {
                if (filename != (char *)0x0) {
                  *puVar7 = '\0';
                }
                iVar4 = lws_b64_decode_string_len
                                  ((char *)(puVar8 + 1),(int)puVar7 - (int)(puVar8 + 1),
                                   (char *)local_48,(int)lVar3);
                *amount = (long)iVar4;
                *ppuVar2 = local_48;
                return 0;
              }
              format = "d\n";
            }
          }
        }
        else {
          format = "b\n";
        }
LAB_0012a098:
        _lws_log(1,format);
        lws_realloc(local_48,0,"lws_free");
        iVar4 = 4;
      }
    }
    else {
      iVar4 = 0;
      puVar5 = (uint8_t *)lws_realloc((void *)0x0,inlen,"alloc_der");
      if (puVar5 == (uint8_t *)0x0) {
        iVar4 = 1;
      }
      else {
        local_48 = puVar5;
        memcpy(puVar5,inbuf,inlen);
        *local_40 = puVar5;
        *amount = inlen;
      }
    }
  }
  return iVar4;
}

Assistant:

int
lws_tls_alloc_pem_to_der_file(struct lws_context *context, const char *filename,
			      const char *inbuf, lws_filepos_t inlen,
			      uint8_t **buf, lws_filepos_t *amount)
{
	uint8_t *pem = NULL, *p, *end, *opem;
	lws_filepos_t len;
	uint8_t *q;
	int n;

	if (filename) {
		n = alloc_file(context, filename, (uint8_t **)&pem, &len);
		if (n)
			return n;
	} else {
		pem = (uint8_t *)inbuf;
		len = inlen;
	}

	opem = p = pem;
	end = p + len;

	if (strncmp((char *)p, "-----", 5)) {

		/* take it as being already DER */

		pem = lws_malloc((size_t)inlen, "alloc_der");
		if (!pem)
			return 1;

		memcpy(pem, inbuf, (size_t)inlen);

		*buf = pem;
		*amount = inlen;

		return 0;
	}

	/* PEM -> DER */

	if (!filename) {
		/* we don't know if it's in const memory... alloc the output */
		pem = lws_malloc(((size_t)inlen * 3) / 4, "alloc_der");
		if (!pem) {
			lwsl_err("a\n");
			return 1;
		}


	} /* else overwrite the allocated, b64 input with decoded DER */

	/* trim the first line */

	p += 5;
	while (p < end && *p != '\n' && *p != '-')
		p++;

	if (*p != '-') {
		lwsl_err("b\n");
		goto bail;
	}

	while (p < end && *p != '\n')
		p++;

	if (p >= end) {
		lwsl_err("c\n");
		goto bail;
	}

	p++;

	/* trim the last line */

	q = (uint8_t *)end - 2;

	while (q > opem && *q != '\n')
		q--;

	if (*q != '\n') {
		lwsl_err("d\n");
		goto bail;
	}

	/* we can't write into the input buffer for mem, since it may be in RO
	 * const segment
	 */
	if (filename)
		*q = '\0';

	*amount = lws_b64_decode_string_len((char *)p, lws_ptr_diff(q, p),
					    (char *)pem, (int)(long long)len);
	*buf = (uint8_t *)pem;

	return 0;

bail:
	lws_free((uint8_t *)pem);

	return 4;
}